

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void set_y_mode_and_delta_angle(int mode_idx,MB_MODE_INFO *mbmi,int reorder_delta_angle_eval)

{
  int iVar1;
  char local_1c;
  int delta_angle_eval_idx;
  int reorder_delta_angle_eval_local;
  MB_MODE_INFO *mbmi_local;
  int mode_idx_local;
  
  if (mode_idx < 0xd) {
    mbmi->mode = ""[mode_idx];
    mbmi->angle_delta[0] = '\0';
  }
  else {
    mbmi->mode = (char)((mode_idx + -0xd) / 6) + '\x01';
    iVar1 = (mode_idx + -0xd) % 6;
    if (reorder_delta_angle_eval == 0) {
      if (iVar1 < 3) {
        local_1c = (char)iVar1 + -3;
      }
      else {
        local_1c = (char)iVar1 + -2;
      }
      mbmi->angle_delta[0] = local_1c;
    }
    else {
      mbmi->angle_delta[0] = luma_delta_angles_order[iVar1];
    }
  }
  return;
}

Assistant:

void set_y_mode_and_delta_angle(const int mode_idx, MB_MODE_INFO *const mbmi,
                                int reorder_delta_angle_eval) {
  if (mode_idx < INTRA_MODE_END) {
    mbmi->mode = intra_rd_search_mode_order[mode_idx];
    mbmi->angle_delta[PLANE_TYPE_Y] = 0;
  } else {
    mbmi->mode = (mode_idx - INTRA_MODE_END) / (MAX_ANGLE_DELTA * 2) + V_PRED;
    int delta_angle_eval_idx =
        (mode_idx - INTRA_MODE_END) % (MAX_ANGLE_DELTA * 2);
    if (reorder_delta_angle_eval) {
      mbmi->angle_delta[PLANE_TYPE_Y] =
          luma_delta_angles_order[delta_angle_eval_idx];
    } else {
      mbmi->angle_delta[PLANE_TYPE_Y] =
          (delta_angle_eval_idx < 3 ? (delta_angle_eval_idx - 3)
                                    : (delta_angle_eval_idx - 2));
    }
  }
}